

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void deqp::gls::BuiltinPrecisionTests::
     ContainerTraits<tcu::Matrix<float,_2,_3>,_tcu::Matrix<tcu::Interval,_2,_3>_>::doPrintIVal
               (FloatFormat *fmt,IVal *ival,ostream *os)

{
  bool *pbVar1;
  long lVar2;
  IVal local_68;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  lVar2 = 0;
  do {
    if (lVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    local_68.m_data[0].m_hi = *(double *)((long)&(ival->m_data).m_data[0].m_data[0].m_hi + lVar2);
    pbVar1 = &(ival->m_data).m_data[0].m_data[0].m_hasNaN + lVar2;
    local_68.m_data[0]._0_8_ = *(undefined8 *)pbVar1;
    local_68.m_data[0].m_lo = *(double *)(pbVar1 + 8);
    local_68.m_data[1].m_hi = *(double *)((long)&(ival->m_data).m_data[0].m_data[1].m_hi + lVar2);
    pbVar1 = &(ival->m_data).m_data[0].m_data[1].m_hasNaN + lVar2;
    local_68.m_data[1]._0_8_ = *(undefined8 *)pbVar1;
    local_68.m_data[1].m_lo = *(double *)(pbVar1 + 8);
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doPrintIVal
              (fmt,&local_68,os);
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x90);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return;
}

Assistant:

static void			doPrintIVal		(const FloatFormat& fmt, const IVal ival, ostream& os)
	{
		os << "(";

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
		{
			if (ndx > 0)
				os << ", ";

			printIVal<Element>(fmt, ival[ndx], os);
		}

		os << ")";
	}